

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O0

void png_set_filter(png_structrp png_ptr,int method,int filters)

{
  png_bytep ppVar1;
  byte bVar2;
  ulong local_38;
  png_alloc_size_t buf_size;
  uint local_18;
  int num_filters;
  int filters_local;
  int method_local;
  png_structrp png_ptr_local;
  
  local_18._0_1_ = (png_byte)filters;
  if (png_ptr != (png_structrp)0x0) {
    num_filters = method;
    if (((png_ptr->mng_features_permitted & 4) != 0) && (method == 0x40)) {
      num_filters = 0;
    }
    if (num_filters != 0) {
      png_error(png_ptr,"Unknown custom filter method");
    }
    switch((png_byte)local_18) {
    case '\x01':
      png_ptr->do_filter = '\x10';
      break;
    case '\x02':
      png_ptr->do_filter = ' ';
      break;
    case '\x03':
      png_ptr->do_filter = '@';
      break;
    case '\x04':
      png_ptr->do_filter = 0x80;
      break;
    case '\x05':
    case '\x06':
    case '\a':
      png_app_error(png_ptr,"Unknown row filter for method 0");
    case '\0':
      png_ptr->do_filter = '\b';
      break;
    default:
      png_ptr->do_filter = (png_byte)local_18;
    }
    if (png_ptr->row_buf != (png_bytep)0x0) {
      local_18 = filters;
      if (png_ptr->height == 1) {
        local_18 = filters & 0xffffff1f;
      }
      if (png_ptr->width == 1) {
        local_18 = local_18 & 0xffffff2f;
      }
      if (((local_18 & 0xe0) != 0) && (png_ptr->prev_row == (png_bytep)0x0)) {
        png_app_warning(png_ptr,"png_set_filter: UP/AVG/PAETH cannot be added after start");
        local_18 = local_18 & 0xffffff1f;
      }
      bVar2 = (local_18 & 0x10) != 0;
      if ((local_18 & 0x20) != 0) {
        bVar2 = bVar2 + 1;
      }
      if ((local_18 & 0x40) != 0) {
        bVar2 = bVar2 + 1;
      }
      if ((local_18 & 0x80) != 0) {
        bVar2 = bVar2 + 1;
      }
      if ((uint)png_ptr->usr_channels * (uint)png_ptr->usr_bit_depth < 8) {
        local_38 = (ulong)png_ptr->width *
                   (long)(int)((uint)png_ptr->usr_channels * (uint)png_ptr->usr_bit_depth) + 7 >> 3;
      }
      else {
        local_38 = (ulong)png_ptr->width *
                   ((ulong)(long)(int)((uint)png_ptr->usr_channels * (uint)png_ptr->usr_bit_depth)
                   >> 3);
      }
      if (png_ptr->try_row == (png_bytep)0x0) {
        ppVar1 = (png_bytep)png_malloc(png_ptr,local_38 + 1);
        png_ptr->try_row = ppVar1;
      }
      if ((1 < bVar2) && (png_ptr->tst_row == (png_bytep)0x0)) {
        ppVar1 = (png_bytep)png_malloc(png_ptr,local_38 + 1);
        png_ptr->tst_row = ppVar1;
      }
    }
    png_ptr->do_filter = (png_byte)local_18;
  }
  return;
}

Assistant:

void PNGAPI
png_set_filter(png_structrp png_ptr, int method, int filters)
{
   png_debug(1, "in png_set_filter");

   if (png_ptr == NULL)
      return;

#ifdef PNG_MNG_FEATURES_SUPPORTED
   if ((png_ptr->mng_features_permitted & PNG_FLAG_MNG_FILTER_64) != 0 &&
       (method == PNG_INTRAPIXEL_DIFFERENCING))
      method = PNG_FILTER_TYPE_BASE;

#endif
   if (method == PNG_FILTER_TYPE_BASE)
   {
      switch (filters & (PNG_ALL_FILTERS | 0x07))
      {
#ifdef PNG_WRITE_FILTER_SUPPORTED
         case 5:
         case 6:
         case 7: png_app_error(png_ptr, "Unknown row filter for method 0");
#endif /* WRITE_FILTER */
            /* FALLTHROUGH */
         case PNG_FILTER_VALUE_NONE:
            png_ptr->do_filter = PNG_FILTER_NONE; break;

#ifdef PNG_WRITE_FILTER_SUPPORTED
         case PNG_FILTER_VALUE_SUB:
            png_ptr->do_filter = PNG_FILTER_SUB; break;

         case PNG_FILTER_VALUE_UP:
            png_ptr->do_filter = PNG_FILTER_UP; break;

         case PNG_FILTER_VALUE_AVG:
            png_ptr->do_filter = PNG_FILTER_AVG; break;

         case PNG_FILTER_VALUE_PAETH:
            png_ptr->do_filter = PNG_FILTER_PAETH; break;

         default:
            png_ptr->do_filter = (png_byte)filters; break;
#else
         default:
            png_app_error(png_ptr, "Unknown row filter for method 0");
#endif /* WRITE_FILTER */
      }

#ifdef PNG_WRITE_FILTER_SUPPORTED
      /* If we have allocated the row_buf, this means we have already started
       * with the image and we should have allocated all of the filter buffers
       * that have been selected.  If prev_row isn't already allocated, then
       * it is too late to start using the filters that need it, since we
       * will be missing the data in the previous row.  If an application
       * wants to start and stop using particular filters during compression,
       * it should start out with all of the filters, and then remove them
       * or add them back after the start of compression.
       *
       * NOTE: this is a nasty constraint on the code, because it means that the
       * prev_row buffer must be maintained even if there are currently no
       * 'prev_row' requiring filters active.
       */
      if (png_ptr->row_buf != NULL)
      {
         int num_filters;
         png_alloc_size_t buf_size;

         /* Repeat the checks in png_write_start_row; 1 pixel high or wide
          * images cannot benefit from certain filters.  If this isn't done here
          * the check below will fire on 1 pixel high images.
          */
         if (png_ptr->height == 1)
            filters &= ~(PNG_FILTER_UP|PNG_FILTER_AVG|PNG_FILTER_PAETH);

         if (png_ptr->width == 1)
            filters &= ~(PNG_FILTER_SUB|PNG_FILTER_AVG|PNG_FILTER_PAETH);

         if ((filters & (PNG_FILTER_UP|PNG_FILTER_AVG|PNG_FILTER_PAETH)) != 0
            && png_ptr->prev_row == NULL)
         {
            /* This is the error case, however it is benign - the previous row
             * is not available so the filter can't be used.  Just warn here.
             */
            png_app_warning(png_ptr,
                "png_set_filter: UP/AVG/PAETH cannot be added after start");
            filters &= ~(PNG_FILTER_UP|PNG_FILTER_AVG|PNG_FILTER_PAETH);
         }

         num_filters = 0;

         if (filters & PNG_FILTER_SUB)
            num_filters++;

         if (filters & PNG_FILTER_UP)
            num_filters++;

         if (filters & PNG_FILTER_AVG)
            num_filters++;

         if (filters & PNG_FILTER_PAETH)
            num_filters++;

         /* Allocate needed row buffers if they have not already been
          * allocated.
          */
         buf_size = PNG_ROWBYTES(png_ptr->usr_channels * png_ptr->usr_bit_depth,
             png_ptr->width) + 1;

         if (png_ptr->try_row == NULL)
            png_ptr->try_row = png_voidcast(png_bytep,
                png_malloc(png_ptr, buf_size));

         if (num_filters > 1)
         {
            if (png_ptr->tst_row == NULL)
               png_ptr->tst_row = png_voidcast(png_bytep,
                   png_malloc(png_ptr, buf_size));
         }
      }
      png_ptr->do_filter = (png_byte)filters;
#endif
   }
   else
      png_error(png_ptr, "Unknown custom filter method");
}